

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncheck.cpp
# Opt level: O3

bool validate(char *dirname)

{
  char cVar1;
  byte bVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  size_t sVar6;
  char *pcVar7;
  char *pcVar8;
  uchar *__ptr;
  int i;
  long lVar9;
  ulong uVar10;
  char *__s;
  ulong uVar11;
  undefined1 auVar12 [16];
  dirent **entry_list;
  ParsedJson pj;
  allocator<char> local_e1;
  uint local_e0;
  undefined4 local_dc;
  dirent **local_d8;
  void *local_d0;
  long local_c8;
  ulong local_c0;
  uint local_b4;
  size_t local_b0;
  long local_a8;
  char *local_a0;
  char *local_98;
  long *local_90 [2];
  long local_80 [10];
  
  local_b0 = strlen(dirname);
  uVar4 = scandir(dirname,&local_d8,(__selector *)0x0,alphasort);
  if ((int)uVar4 < 0) {
    bVar2 = 0;
    fprintf(_stderr,"error accessing %s \n",dirname);
  }
  else if (uVar4 == 0) {
    bVar2 = 0;
    printf("nothing in dir %s \n",dirname);
  }
  else {
    uVar11 = (ulong)uVar4;
    local_d0 = operator_new__(uVar11);
    memset(local_d0,1,uVar11);
    sVar6 = strlen(dirname);
    if (sVar6 < 2) {
      local_dc = 0;
    }
    else {
      local_dc = (undefined4)CONCAT71((int7)(sVar6 >> 8),dirname[sVar6 - 1] != '/');
    }
    local_a8 = local_b0 + 2;
    local_e0 = (uint)CONCAT71((int7)((ulong)local_a8 >> 8),1);
    uVar10 = 0;
    local_c8 = 0;
    local_c0 = uVar11;
    local_b4 = uVar4;
    local_a0 = dirname;
    do {
      __s = local_d8[uVar10]->d_name;
      pcVar7 = strrchr(__s,0x2e);
      if ((pcVar7 != (char *)0x0) && (iVar5 = strcmp(pcVar7,".json"), iVar5 == 0)) {
        printf("validating: file %s ",__s);
        fflush((FILE *)0x0);
        sVar6 = strlen(__s);
        pcVar8 = (char *)malloc(sVar6 + local_a8);
        strcpy(pcVar8,local_a0);
        pcVar7 = pcVar8 + local_b0;
        if ((char)local_dc != '\0') {
          *pcVar7 = '/';
          pcVar7 = pcVar7 + 1;
        }
        strcpy(pcVar7,__s);
        std::__cxx11::string::string<std::allocator<char>>((string *)local_90,pcVar8,&local_e1);
        auVar12 = get_corpus((string *)local_90);
        __ptr = auVar12._8_8_;
        local_98 = pcVar8;
        if (local_90[0] != local_80) {
          operator_delete(local_90[0],local_80[0] + 1);
        }
        ParsedJson::ParsedJson((ParsedJson *)local_90);
        cVar1 = ParsedJson::allocateCapacity((ulong)local_90,auVar12._0_8_);
        if (cVar1 == '\0') {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"can\'t allocate memory",0x15);
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'x');
          std::ostream::put('x');
          std::ostream::flush();
          ParsedJson::~ParsedJson((ParsedJson *)local_90);
          bVar2 = 0;
          goto LAB_0010279d;
        }
        bVar2 = json_parse(__ptr,auVar12._0_8_,(ParsedJson *)local_90,true);
        pcVar7 = local_98;
        if (__ptr != (uchar *)0x0) {
          free(__ptr);
        }
        pcVar8 = "invalid";
        if (bVar2 != 0) {
          pcVar8 = "ok";
        }
        puts(pcVar8);
        pcVar8 = strstr(__s,"EXCLUDE");
        if (pcVar8 == (char *)0x0) {
          lVar9 = local_c8 + 1;
          bVar3 = startsWith("pass",__s);
          local_c8 = lVar9;
          if (bVar3) {
            pcVar8 = "warning: file %s should pass but it fails.\n";
            if (bVar2 == 0) {
LAB_001026fd:
              *(undefined1 *)((long)local_d0 + uVar10) = 0;
              local_e0 = 0;
              printf(pcVar8,__s);
            }
          }
          else {
            bVar3 = startsWith("fail",__s);
            pcVar8 = "warning: file %s should fail but it passes.\n";
            if ((bVar2 & bVar3) == 1) goto LAB_001026fd;
          }
        }
        free(pcVar7);
        ParsedJson::~ParsedJson((ParsedJson *)local_90);
      }
      uVar11 = local_c0;
      uVar10 = uVar10 + 1;
    } while (local_c0 != uVar10);
    printf("%zu files checked.\n",local_c8);
    bVar2 = (byte)local_e0;
    if ((local_e0 & 1) == 0) {
      validate();
    }
    else {
      puts("All ok!");
    }
    uVar10 = 0;
    do {
      free(local_d8[uVar10]);
      uVar10 = uVar10 + 1;
    } while (uVar11 != uVar10);
    free(local_d8);
    operator_delete__(local_d0);
  }
LAB_0010279d:
  return (bool)(bVar2 & 1);
}

Assistant:

bool validate(const char *dirname) {
  bool everythingfine = true;
  const char *extension = ".json";
  size_t dirlen = strlen(dirname);
  struct dirent **entry_list;
  int c = scandir(dirname, &entry_list, nullptr, alphasort);
  if (c < 0) {
    fprintf(stderr, "error accessing %s \n", dirname);
    return false;
  }
  if (c == 0) {
    printf("nothing in dir %s \n", dirname);
    return false;
  }
  bool * isfileasexpected = new bool[c];
  for(int i = 0; i < c; i++) { isfileasexpected[i] = true;
}
  size_t howmany = 0;
  bool needsep = (strlen(dirname) > 1) && (dirname[strlen(dirname) - 1] != '/');
  for (int i = 0; i < c; i++) {
    const char *name = entry_list[i]->d_name;
    if (hasExtension(name, extension)) {
      printf("validating: file %s ", name);
      fflush(nullptr);
      size_t filelen = strlen(name);
      char *fullpath = static_cast<char *>(malloc(dirlen + filelen + 1 + 1));
      strcpy(fullpath, dirname);
      if (needsep) {
        fullpath[dirlen] = '/';
        strcpy(fullpath + dirlen + 1, name);
      } else {
        strcpy(fullpath + dirlen, name);
      }
      std::string_view p;
      try {
        p = get_corpus(fullpath);
      } catch (const std::exception& e) {
        std::cerr << "Could not load the file " << fullpath << std::endl;
        return EXIT_FAILURE;
      }
      ParsedJson pj;
      bool allocok = pj.allocateCapacity(p.size(), 1024);
      if(!allocok) {
        std::cerr << "can't allocate memory"<<std::endl;
        return false;
      }
      ++howmany;
      bool isok = json_parse(p, pj);
      aligned_free((void*)p.data());
      printf("%s\n", isok ? "ok" : "invalid");
      if(contains("EXCLUDE",name)) {
        // skipping
        howmany--;
      } else if (startsWith("pass", name)) {
        if (!isok) {
          isfileasexpected[i] = false;
          printf("warning: file %s should pass but it fails.\n", name);
          everythingfine = false;
        }
      } else if (startsWith("fail", name)) {
        if (isok) {
          isfileasexpected[i] = false;
          printf("warning: file %s should fail but it passes.\n", name);
          everythingfine = false;
        }
      }
      free(fullpath);
    }
  }
  printf("%zu files checked.\n", howmany);
  if(everythingfine) {
    printf("All ok!\n");
  } else {
    fprintf(stderr, "There were problems! Consider reviewing the following files:\n");
    for(int i = 0; i < c; i++) {
      if(!isfileasexpected[i]) { fprintf(stderr, "%s \n", entry_list[i]->d_name);
}
    }
  }
  for (int i = 0; i < c; ++i) {
    free(entry_list[i]);
}
  free(entry_list);
  delete[] isfileasexpected;
  return everythingfine;
}